

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfGetLin(int64_t MshIdx,int KwdCod,...)

{
  char cVar1;
  char in_AL;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  undefined8 *puVar6;
  uint uVar7;
  long in_RCX;
  void *in_RDX;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  undefined8 uVar11;
  int *in_R8;
  undefined8 in_R9;
  undefined4 *puVar12;
  undefined4 uVar13;
  long lVar14;
  void *pvVar15;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int iStack_130;
  va_list VarArg;
  float FltVal;
  int IntVal;
  double DblVal;
  int64_t LngVal;
  int *local_f0;
  void *local_e8 [3];
  long local_d0;
  int *local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (KwdCod < 0) {
    KwdCod = -KwdCod;
    puVar12 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar13 = 5;
  }
  else {
    puVar12 = (undefined4 *)(MshIdx + (ulong)(uint)KwdCod * 0x3300 + 0x110);
    uVar13 = *puVar12;
  }
  iVar3 = 0;
  if (0xffffff0f < KwdCod - 0xf1U) {
    local_e8[2] = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    iVar2 = _setjmp((__jmp_buf_tag *)(MshIdx + 0x48));
    lVar9 = local_d0;
    pvVar15 = local_e8[2];
    if (iVar2 == 0) {
      VarArg[0].overflow_arg_area = &stack0x00000008;
      uVar7 = 0x10;
      switch(uVar13) {
      case 1:
      case 2:
      case 4:
        if ((*(byte *)(MshIdx + 0xc) & 1) == 0) {
          for (lVar9 = 0; lVar9 < (int)puVar12[3]; lVar9 = lVar9 + 1) {
            cVar1 = *(char *)((long)puVar12 + lVar9 + 0xfd8);
            if (cVar1 == 'c') {
              uVar4 = (ulong)uVar7;
              if (uVar4 < 0x29) {
                uVar7 = uVar7 + 8;
                puVar6 = (undefined8 *)((long)local_e8 + uVar4);
              }
              else {
                puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
              }
              sVar5 = fread((void *)*puVar6,4,0x40,*(FILE **)(MshIdx + 0x300410));
              if (sVar5 != 0x40) {
                iStack_130 = -3;
                goto LAB_0010b83d;
              }
            }
            else if (cVar1 == 'i') {
              if (3 < *(int *)(MshIdx + 4)) goto LAB_0010b28a;
LAB_0010b2a7:
              uVar4 = (ulong)uVar7;
              if (uVar7 < 0x29) {
                uVar7 = uVar7 + 8;
                puVar6 = (undefined8 *)((long)local_e8 + uVar4);
              }
              else {
                puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
              }
              ScaWrd((GmfMshSct *)MshIdx,(void *)*puVar6);
            }
            else if (cVar1 == 'r') {
              if (*(int *)(MshIdx + 0x18) == 0x20) goto LAB_0010b2a7;
LAB_0010b28a:
              uVar4 = (ulong)uVar7;
              if (uVar7 < 0x29) {
                uVar7 = uVar7 + 8;
                puVar6 = (undefined8 *)((long)local_e8 + uVar4);
              }
              else {
                puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
              }
              ScaDblWrd((GmfMshSct *)MshIdx,(void *)*puVar6);
            }
          }
        }
        else {
          for (lVar9 = 0; lVar9 < (int)puVar12[3]; lVar9 = lVar9 + 1) {
            cVar1 = *(char *)((long)puVar12 + lVar9 + 0xfd8);
            if (cVar1 == 'c') {
              uVar4 = (ulong)uVar7;
              if (uVar4 < 0x29) {
                uVar7 = uVar7 + 8;
                puVar6 = (undefined8 *)((long)local_e8 + uVar4);
              }
              else {
                puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
              }
              pcVar10 = fgets((char *)*puVar6,0x40,*(FILE **)(MshIdx + 0x300410));
              if (pcVar10 == (char *)0x0) {
                iStack_130 = -2;
                goto LAB_0010b83d;
              }
            }
            else if (cVar1 == 'i') {
              uVar11 = *(undefined8 *)(MshIdx + 0x300410);
              uVar4 = (ulong)uVar7;
              if (*(int *)(MshIdx + 4) < 4) {
                if (uVar7 < 0x29) {
                  uVar7 = uVar7 + 8;
                  puVar6 = (undefined8 *)((long)local_e8 + uVar4);
                }
                else {
                  puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                  VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
                }
                uVar8 = *puVar6;
                pcVar10 = "%d";
              }
              else {
                if (uVar7 < 0x29) {
                  uVar7 = uVar7 + 8;
                  puVar6 = (undefined8 *)((long)local_e8 + uVar4);
                }
                else {
                  puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                  VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
                }
                uVar8 = *puVar6;
                pcVar10 = "%ld";
              }
LAB_0010b4b9:
              iVar3 = __isoc99_fscanf(uVar11,pcVar10,uVar8);
              if (iVar3 != 1) goto LAB_0010b83b;
            }
            else if (cVar1 == 'r') {
              if (*(int *)(MshIdx + 0x18) != 0x20) {
                uVar4 = (ulong)uVar7;
                if (uVar4 < 0x29) {
                  uVar7 = uVar7 + 8;
                  puVar6 = (undefined8 *)((long)local_e8 + uVar4);
                }
                else {
                  puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                  VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
                }
                uVar8 = *puVar6;
                uVar11 = *(undefined8 *)(MshIdx + 0x300410);
                pcVar10 = "%lf";
                goto LAB_0010b4b9;
              }
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",&FltVal);
              if (iVar3 != 1) goto LAB_0010b83b;
              uVar4 = (ulong)uVar7;
              if (uVar4 < 0x29) {
                uVar7 = uVar7 + 8;
                puVar6 = (undefined8 *)((long)local_e8 + uVar4);
              }
              else {
                puVar6 = (undefined8 *)VarArg[0].overflow_arg_area;
                VarArg[0].overflow_arg_area = (void *)((long)VarArg[0].overflow_arg_area + 8);
              }
              *(float *)*puVar6 = FltVal;
            }
          }
        }
        break;
      case 3:
        if (*(int *)(MshIdx + 0x18) == 0x20) {
          if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
            lVar9 = -1;
            do {
              lVar9 = lVar9 + 1;
              if ((int)puVar12[3] <= lVar9) goto switchD_0010b240_default;
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",pvVar15);
              pvVar15 = (void *)((long)pvVar15 + 4);
            } while (iVar3 == 1);
LAB_0010b83b:
            iStack_130 = -1;
LAB_0010b83d:
            longjmp((__jmp_buf_tag *)(MshIdx + 0x48),iStack_130);
          }
          for (lVar9 = 0; lVar9 < (int)puVar12[3]; lVar9 = lVar9 + 1) {
            ScaWrd((GmfMshSct *)MshIdx,pvVar15);
            pvVar15 = (void *)((long)pvVar15 + 4);
          }
        }
        else {
          if ((*(byte *)(MshIdx + 0xc) & 1) != 0) {
            lVar9 = -1;
            do {
              lVar9 = lVar9 + 1;
              if ((int)puVar12[3] <= lVar9) goto switchD_0010b240_default;
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%lf",pvVar15);
              pvVar15 = (void *)((long)pvVar15 + 8);
            } while (iVar3 == 1);
            goto LAB_0010b83b;
          }
          for (lVar9 = 0; lVar9 < (int)puVar12[3]; lVar9 = lVar9 + 1) {
            ScaDblWrd((GmfMshSct *)MshIdx,pvVar15);
            pvVar15 = (void *)((long)pvVar15 + 8);
          }
        }
        break;
      case 5:
        local_f0 = local_c8;
        for (lVar14 = 0; lVar14 < (int)puVar12[3]; lVar14 = lVar14 + 1) {
          cVar1 = *(char *)((long)puVar12 + lVar14 + 0xfd8);
          if (cVar1 == 'r') {
            if (*(int *)(MshIdx + 0x18) == 0x20) {
              if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                ScaWrd((GmfMshSct *)MshIdx,&FltVal);
              }
              else {
                iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%f",&FltVal);
                if (iVar3 != 1) goto LAB_0010b83b;
              }
              DblVal = (double)FltVal;
            }
            else if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
              ScaDblWrd((GmfMshSct *)MshIdx,&DblVal);
            }
            else {
              iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%lf",&DblVal);
              if (iVar3 != 1) goto LAB_0010b83b;
            }
            *(double *)(lVar9 + lVar14 * 8) = DblVal;
          }
          else if (cVar1 == 'i') {
            if (*(int *)(MshIdx + 4) < 4) {
              if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                ScaWrd((GmfMshSct *)MshIdx,&IntVal);
              }
              else {
                iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%d",&IntVal);
                if (iVar3 != 1) goto LAB_0010b83b;
              }
            }
            else {
              if ((*(uint *)(MshIdx + 0xc) & 1) == 0) {
                ScaDblWrd((GmfMshSct *)MshIdx,&LngVal);
              }
              else {
                iVar3 = __isoc99_fscanf(*(undefined8 *)(MshIdx + 0x300410),"%ld",&LngVal);
                if (iVar3 != 1) goto LAB_0010b83b;
              }
              IntVal = (int)LngVal;
            }
            if ((""[(uint)KwdCod] == '\0') || (lVar14 < (long)(int)puVar12[3] + -1)) {
              *(int *)((long)pvVar15 + lVar14 * 4) = IntVal;
            }
            else {
              *local_f0 = IntVal;
            }
          }
        }
      }
switchD_0010b240_default:
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int GmfGetLin(int64_t MshIdx, int KwdCod, ...)
{
   int         i, err, typ, *IntTab, *RefPtr, IntVal;
   int64_t     LngVal;
   float       *FltSolTab, FltVal, *PtrFlt;
   double      *DblSolTab, *PtrDbl, *DblTab, DblVal;
   va_list     VarArg;
   GmfMshSct   *msh = (GmfMshSct *)MshIdx;
   KwdSct      *kwd;

   // Special trick: if the kwd is negative the call come from Fortran
   if(KwdCod < 0)
   {
      // Set Fortran mode ON
      KwdCod = -KwdCod;
      kwd = &msh->KwdTab[ KwdCod ];
      typ = F77Kwd;
   }
   else
   {
      kwd = &msh->KwdTab[ KwdCod ];
      typ = kwd->typ;
   }

   if( (KwdCod < 1) || (KwdCod > GmfMaxKwd) )
      return(0);

   // Save the current stack environment for longjmp
   if( (err = setjmp(msh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", msh, err);
#endif
      return(0);
   }

   // Start decoding the arguments
   va_start(VarArg, KwdCod);

   switch(typ)
   {
      case InfKwd : case RegKwd : case CmtKwd :
      {
         if(msh->typ & Asc)
         {
            for(i=0;i<kwd->SolSiz;i++)
            {
               if(kwd->fmt[i] == 'r')
               {
                  if(msh->FltSiz == 32)
                  {
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                     PtrDbl = va_arg(VarArg, double *);
                     PtrFlt = (float *)PtrDbl;
                     *PtrFlt = FltVal;
                  }                     
                  else
                  {
                     PtrDbl = va_arg(VarArg, double *);
                     safe_fscanf(msh->hdl, "%lf",PtrDbl, msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'i')
               {
                  if(msh->ver <= 3)
                  {
                     safe_fscanf(msh->hdl, "%d",
                        va_arg(VarArg, int *), msh->err);
                  }
                  else
                  {
                     // [Bruno] %ld -> INT64_T_FMT
                     safe_fscanf(msh->hdl, INT64_T_FMT,
                              va_arg(VarArg, int64_t *), msh->err);
                  }
               }
               else if(kwd->fmt[i] == 'c')
               {
                  safe_fgets(va_arg(VarArg, char *), FilStrSiz, msh->hdl, msh->err);
               }
            }
         }
         else
         {
            for(i=0;i<kwd->SolSiz;i++)
               if(kwd->fmt[i] == 'r')
                  if(msh->FltSiz == 32)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, float *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, double *));
               else if(kwd->fmt[i] == 'i')
                  if(msh->ver <= 3)
                     ScaWrd(msh, (unsigned char *)va_arg(VarArg, int *));
                  else
                     ScaDblWrd(msh, (unsigned char *)va_arg(VarArg, int64_t *));
               else if(kwd->fmt[i] == 'c')
                  // [Bruno] added error control
                  safe_fread(va_arg(VarArg, char *), WrdSiz, FilStrSiz, msh->hdl, msh->err);
         }
      }break;

      case SolKwd :
      {
         if(msh->FltSiz == 32)
         {
            FltSolTab = va_arg(VarArg, float *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%f", &FltSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaWrd(msh, (unsigned char *)&FltSolTab[i]);
         }
         else
         {
            DblSolTab = va_arg(VarArg, double *);

            if(msh->typ & Asc)
               for(i=0; i<kwd->SolSiz; i++)
                  safe_fscanf(msh->hdl, "%lf", &DblSolTab[i], msh->err);
            else
               for(i=0; i<kwd->SolSiz; i++)
                  ScaDblWrd(msh, (unsigned char *)&DblSolTab[i]);
         }
      }break;

      case F77Kwd :
      {
         IntTab = va_arg(VarArg, int *);
         DblTab = va_arg(VarArg, double *);
         RefPtr = va_arg(VarArg, int *);

         for(i=0;i<kwd->SolSiz;i++)
         {
            if(kwd->fmt[i] == 'i')
            {
               if(msh->ver <= 3)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%d", &IntVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&IntVal);
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, INT64_T_FMT, &LngVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&LngVal);

                  IntVal = (int)LngVal;
               }

               if(!F77RefFlg[ KwdCod ] || (i < kwd->SolSiz - 1))
                  IntTab[i] = IntVal;
               else
                  *RefPtr = IntVal;
            }
            else if(kwd->fmt[i] == 'r')
            {
               if(msh->FltSiz == 32)
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%f", &FltVal, msh->err);
                  else
                     ScaWrd(msh, (unsigned char *)&FltVal);

                  DblVal = (double)FltVal;
               }
               else
               {
                  if(msh->typ & Asc)
                     safe_fscanf(msh->hdl, "%lf", &DblVal, msh->err);
                  else
                     ScaDblWrd(msh, (unsigned char *)&DblVal);
               }

               DblTab[i] = DblVal;
            }
         }
      }break;
   }

   va_end(VarArg);

   return(1);
}